

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::SendKeepAlive
          (CommissionerImpl *this,Timer *param_1,bool aKeepAlive)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Error *pEVar4;
  char *this_00;
  v10 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  int8_t local_589;
  string local_580;
  anon_class_1_0_00000001 local_55a;
  v10 local_559;
  v10 *local_558;
  char *local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  allocator local_521;
  string local_520;
  ErrorCode local_500;
  anon_class_1_0_00000001 local_4fa;
  v10 local_4f9;
  v10 *local_4f8;
  char *local_4f0;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  ResponseHandler local_4a0;
  rep local_480;
  ErrorCode local_474;
  Error local_470;
  ErrorCode local_444;
  Tlv local_440;
  Error local_420;
  ErrorCode local_3f4;
  Tlv local_3f0;
  Error local_3d0;
  ErrorCode local_3a8;
  allocator local_3a1;
  string local_3a0;
  Error local_380;
  anon_class_1_0_00000001 local_352;
  v10 local_351;
  v10 *local_350;
  size_t local_348;
  string local_340;
  Error local_320;
  anon_class_8_1_8991fb9c local_2f8;
  anon_class_8_1_8991fb9c onResponse;
  int8_t state;
  undefined1 local_2e0 [8];
  Request request;
  Error error;
  bool aKeepAlive_local;
  Timer *param_2_local;
  CommissionerImpl *this_local;
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  char *local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> *local_198;
  v10 *local_190;
  char *pcStack_188;
  string *local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178 [3];
  undefined1 local_160 [16];
  v10 *local_150;
  char *local_148;
  string *local_140;
  v10 *local_138;
  char *pcStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  v10 *local_120;
  v10 **local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  CommissionerImpl **local_d0;
  undefined1 *local_c8;
  CommissionerImpl **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  CommissionerImpl **local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_78;
  v10 **local_70;
  v10 *local_68;
  char *pcStack_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_28;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  error.mMessage.field_2._M_local_buf[0xf] = aKeepAlive;
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_2e0,kConfirmable,kPost);
  local_589 = '\x01';
  if ((error.mMessage.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_589 = -1;
  }
  onResponse.this._3_1_ = local_589;
  local_2f8.this = this;
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) == 0) {
    SendKeepAlive::anon_class_1_0_00000001::operator()(&local_352);
    local_118 = &local_350;
    local_120 = &local_351;
    bVar5 = ::fmt::v10::operator()(local_120);
    local_348 = bVar5.size_;
    local_350 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_1d0 = &local_340;
    local_1e0 = local_350;
    sStack_1d8 = local_348;
    local_f0 = &local_1e0;
    local_1f0 = local_350;
    local_1e8 = local_348;
    local_e8 = local_1f0;
    sStack_e0 = local_1e8;
    this_local = (CommissionerImpl *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c8 = local_200;
    local_d0 = &this_local;
    local_b8 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1e8;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_d0;
    local_c0 = local_d0;
    local_b0 = local_c8;
    local_a8 = local_d0;
    ::fmt::v10::vformat_abi_cxx11_(&local_340,local_1f0,fmt,args);
    Error::Error(&local_320,kInvalidState,&local_340);
    Error::operator=((Error *)&request.mEndpoint,&local_320);
    Error::~Error(&local_320);
    std::__cxx11::string::~string((string *)&local_340);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"/c/ca",&local_3a1);
    coap::Message::SetUriPath(&local_380,(Message *)local_2e0,&local_3a0);
    pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_380);
    local_3a8 = kNone;
    bVar1 = commissioner::operator!=(pEVar4,&local_3a8);
    Error::~Error(&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    if (!bVar1) {
      tlv::Tlv::Tlv(&local_3f0,kNetworkDiagChildTable,onResponse.this._3_1_,kMeshCoP);
      AppendTlv(&local_3d0,(Message *)local_2e0,&local_3f0);
      pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_3d0);
      local_3f4 = kNone;
      bVar1 = commissioner::operator!=(pEVar4,&local_3f4);
      Error::~Error(&local_3d0);
      tlv::Tlv::~Tlv(&local_3f0);
      if (!bVar1) {
        iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
        tlv::Tlv::Tlv(&local_440,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
        AppendTlv(&local_420,(Message *)local_2e0,&local_440);
        pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_420);
        local_444 = kNone;
        bVar1 = commissioner::operator!=(pEVar4,&local_444);
        Error::~Error(&local_420);
        tlv::Tlv::~Tlv(&local_440);
        if (!bVar1) {
          uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
          if ((uVar2 & 1) != 0) {
            SignRequest(&local_470,this,(Request *)local_2e0,kMeshCoP,false);
            pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_470);
            local_474 = kNone;
            bVar1 = commissioner::operator!=(pEVar4,&local_474);
            Error::~Error(&local_470);
            if (bVar1) goto LAB_002661ca;
          }
          local_480 = (rep)GetKeepAliveInterval(this);
          Timer::Start(&this->mKeepAliveTimer,(Duration)local_480);
          std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
          function<ot::commissioner::CommissionerImpl::SendKeepAlive(ot::commissioner::Timer&,bool)::__0&,void>
                    ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                      *)&local_4a0,&local_2f8);
          coap::CoapSecure::SendRequest(&this->mBrClient,(Request *)local_2e0,&local_4a0);
          std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
          ~function(&local_4a0);
          std::allocator<char>::allocator();
          this_00 = "meshcop";
          std::__cxx11::string::string((string *)&local_4c0,"meshcop",&local_4c1);
          SendKeepAlive::anon_class_1_0_00000001::operator()(&local_4fa);
          local_108 = &local_4f8;
          local_110 = &local_4f9;
          bVar5 = ::fmt::v10::operator()(local_110);
          local_4f0 = (char *)bVar5.size_;
          local_4f8 = (v10 *)bVar5.data_;
          ::fmt::v10::detail::check_format_string<bool_&,_FMT_COMPILE_STRING,_0>();
          local_180 = &local_4e8;
          local_190 = local_4f8;
          pcStack_188 = local_4f0;
          local_198 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool>
                       *)((long)&error.mMessage.field_2 + 0xf);
          local_70 = &local_190;
          local_1a8 = local_4f8;
          local_1a0 = local_4f0;
          local_68 = local_1a8;
          pcStack_60 = local_1a0;
          local_1c8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,bool>
                                   (local_198,(v10 *)this_00,(bool *)local_180);
          local_48 = local_1b8;
          local_50 = local_1c8;
          local_38 = 7;
          fmt_00.size_ = 7;
          fmt_00.data_ = local_1a0;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_50;
          local_40 = local_50;
          local_30 = local_48;
          local_28 = local_50;
          ::fmt::v10::vformat_abi_cxx11_(&local_4e8,local_1a8,fmt_00,args_00);
          Log(kDebug,&local_4c0,&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
        }
      }
    }
  }
LAB_002661ca:
  local_500 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_500);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_520,"meshcop",&local_521);
    SendKeepAlive::anon_class_1_0_00000001::operator()(&local_55a);
    local_f8 = &local_558;
    local_100 = &local_559;
    bVar5 = ::fmt::v10::operator()(local_100);
    local_550 = (char *)bVar5.size_;
    local_558 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    this_01 = (v10 *)&request.mEndpoint;
    Error::ToString_abi_cxx11_(&local_580,(Error *)this_01);
    local_128 = &local_548;
    local_138 = local_558;
    pcStack_130 = local_550;
    local_140 = &local_580;
    local_20 = &local_138;
    local_150 = local_558;
    local_148 = local_550;
    local_18 = local_150;
    pcStack_10 = local_148;
    local_178[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_140,this_01,local_128);
    local_98 = local_160;
    local_a0 = local_178;
    local_88 = 0xd;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = local_148;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_a0;
    local_90 = local_a0;
    local_80 = local_98;
    local_78 = local_a0;
    ::fmt::v10::vformat_abi_cxx11_(&local_548,local_150,fmt_01,args_01);
    Log(kWarn,&local_520,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    (*(this->super_Commissioner)._vptr_Commissioner[6])();
  }
  coap::Message::~Message((Message *)local_2e0);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::SendKeepAlive(Timer &, bool aKeepAlive)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    auto          state = (aKeepAlive ? tlv::kStateAccept : tlv::kStateReject);

    auto onResponse = [this](const coap::Response *aResponse, Error aError) {
        Error error = HandleStateResponse(aResponse, aError);

        if (error == ErrorCode::kNone)
        {
            mKeepAliveTimer.Start(GetKeepAliveInterval());
            LOG_INFO(LOG_REGION_MESHCOP, "keep alive message accepted, keep-alive timer restarted");
        }
        else
        {
            mState = State::kDisabled;
            Resign([](Error) {});

            LOG_WARN(LOG_REGION_MESHCOP, "keep alive message rejected: {}", error.ToString());
        }

        mCommissionerHandler.OnKeepAliveResponse(error);
    };

    VerifyOrExit(IsActive(),
                 error = ERROR_INVALID_STATE("cannot send keep-alive message the commissioner is not active"));

    SuccessOrExit(error = request.SetUriPath(uri::kKeepAlive));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kState, state}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request, tlv::Scope::kMeshCoP, /* aAppendToken */ false));
    }
#endif

    mKeepAliveTimer.Start(GetKeepAliveInterval());

    mBrClient.SendRequest(request, onResponse);

    LOG_DEBUG(LOG_REGION_MESHCOP, "sent keep alive message: keepAlive={}", aKeepAlive);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_MESHCOP, "sending keep alive message failed: {}", error.ToString());
        Disconnect();
    }
}